

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

void __thiscall GoState<3U,_4U>::GoState(GoState<3U,_4U> *this)

{
  _Rb_tree_header *p_Var1;
  int i;
  long lVar2;
  int j;
  long lVar3;
  uint local_14;
  
  this->_vptr_GoState = (_func_int **)&PTR__GoState_001627d8;
  lVar2 = 0;
  this->previous_board_hash_value = 0;
  p_Var1 = &(this->all_hash_values)._M_t._M_impl.super__Rb_tree_header;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->depth = 0;
  this->player_to_move = 1;
  do {
    lVar3 = 0;
    do {
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_insert_unique<unsigned_int>(&(this->all_hash_values)._M_t,&local_14);
  this->board[2] = (uchar  [4])0x0;
  *(uchar *)((long)(this->board + 0) + 0) = '\0';
  *(uchar *)((long)(this->board + 0) + 1) = '\0';
  *(uchar *)((long)(this->board + 0) + 2) = '\0';
  *(uchar *)((long)(this->board + 0) + 3) = '\0';
  *(uchar *)((long)(this->board + 1) + 0) = '\0';
  *(uchar *)((long)(this->board + 1) + 1) = '\0';
  *(uchar *)((long)(this->board + 1) + 2) = '\0';
  *(uchar *)((long)(this->board + 1) + 3) = '\0';
  return;
}

Assistant:

GoState():
		previous_board_hash_value(0),
		depth(0),
		player_to_move(1)
	{ 
		all_hash_values.insert(compute_hash_value());

		for (int i = 0; i < M; ++i) {
			for (int j = 0; j < N; ++j) {
				board[i][j] =  empty;
			}
		}
	}